

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.hpp
# Opt level: O0

bool __thiscall
libtorrent::aux::session_settings_single_thread::get<bool,std::bitset<72ul>>
          (session_settings_single_thread *this,bitset<72UL> *c,int name,int type)

{
  size_t index;
  int type_local;
  int name_local;
  bitset<72UL> *c_local;
  session_settings_single_thread *this_local;
  
  if ((name & 0xc000U) == type) {
    this_local._7_1_ = std::bitset<72UL>::operator[](c,(long)(int)(name & 0x3fff));
  }
  else {
    this_local._7_1_ = get<bool,_std::bitset<72UL>_>::empty;
  }
  return (bool)this_local._7_1_;
}

Assistant:

T get(Container const& c, int const name, int const type) const
		{
			static typename std::remove_reference<T>::type empty;
			TORRENT_ASSERT((name & settings_pack::type_mask) == type);
			if ((name & settings_pack::type_mask) != type) return empty;
			size_t const index = name & settings_pack::index_mask;
			TORRENT_ASSERT(index < c.size());
			return c[index];
		}